

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Panel.cpp
# Opt level: O2

QVBoxLayout * __thiscall
Panel::createLayout(Panel *this,array<std::function<void_()>,_3UL> *panelSlots,
                   QMainWindow *mainWindow)

{
  map<BoardMode,_QRadioButton,_std::less<BoardMode>,_std::allocator<std::pair<const_BoardMode,_QRadioButton>_>_>
  *this_00;
  function<void_()> *__x;
  Panel *pPVar1;
  mapped_type *pmVar2;
  QVBoxLayout *pQVar3;
  _Base_ptr p_Var4;
  QGroupBox *pQVar5;
  mapped_type *pmVar6;
  QPushButton *this_01;
  QPushButton *this_02;
  QPushButton *this_03;
  int iVar7;
  QArrayDataPointer<char16_t> local_e0;
  QMainWindow *local_c8;
  QGroupBox *local_c0;
  function<void_()> *local_b8;
  Panel *local_b0;
  Object local_a8 [8];
  Object local_a0 [8];
  Object local_98 [8];
  function<void_()> local_90;
  function<void_()> local_70;
  function<void_()> local_50;
  
  local_e0.d._0_4_ = 0;
  local_c8 = mainWindow;
  local_b8 = panelSlots->_M_elems;
  std::
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
  ::_M_emplace_unique<BoardSize,char_const(&)[2]>
            ((_Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
              *)this,(BoardSize *)&local_e0,(char (*) [2])0x116c12);
  local_e0.d._0_4_ = 1;
  std::
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
  ::_M_emplace_unique<BoardSize,char_const(&)[2]>
            ((_Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
              *)this,(BoardSize *)&local_e0,(char (*) [2])0x116d04);
  local_e0.d._0_4_ = 2;
  std::
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
  ::_M_emplace_unique<BoardSize,char_const(&)[2]>
            ((_Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
              *)this,(BoardSize *)&local_e0,(char (*) [2])0x116c46);
  local_e0.d._0_4_ = 3;
  std::
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
  ::_M_emplace_unique<BoardSize,char_const(&)[2]>
            ((_Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
              *)this,(BoardSize *)&local_e0,(char (*) [2])0x116c60);
  local_e0.d._0_4_ = 0;
  pmVar2 = std::
           map<BoardSize,_QRadioButton,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QRadioButton>_>_>
           ::operator[](&this->radioSizeMap,(key_type *)&local_e0);
  QAbstractButton::setChecked(SUB81(pmVar2,0));
  pQVar3 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar3);
  local_b0 = this;
  for (p_Var4 = (this->radioSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->radioSizeMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    QBoxLayout::addSpacing((int)pQVar3);
    QBoxLayout::addWidget(pQVar3,&p_Var4[1]._M_parent,0,0);
    QString::QString((QString *)&local_e0,"margin-left: 5px");
    QWidget::setStyleSheet((QString *)&p_Var4[1]._M_parent);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  }
  QBoxLayout::addSpacing((int)pQVar3);
  pQVar5 = (QGroupBox *)operator_new(0x28);
  QString::QString((QString *)&local_e0,"Dimension of Board");
  QGroupBox::QGroupBox(pQVar5,(QString *)&local_e0,(QWidget *)local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  local_c0 = pQVar5;
  QWidget::setLayout((QLayout *)pQVar5);
  pPVar1 = local_b0;
  this_00 = &local_b0->radioModeMap;
  local_e0.d._0_4_ = 0;
  std::
  _Rb_tree<BoardMode,std::pair<BoardMode_const,QRadioButton>,std::_Select1st<std::pair<BoardMode_const,QRadioButton>>,std::less<BoardMode>,std::allocator<std::pair<BoardMode_const,QRadioButton>>>
  ::_M_emplace_unique<BoardMode,char_const(&)[8]>
            ((_Rb_tree<BoardMode,std::pair<BoardMode_const,QRadioButton>,std::_Select1st<std::pair<BoardMode_const,QRadioButton>>,std::less<BoardMode>,std::allocator<std::pair<BoardMode_const,QRadioButton>>>
              *)this_00,(BoardMode *)&local_e0,(char (*) [8])"Numeric");
  local_e0.d._0_4_ = 1;
  std::
  _Rb_tree<BoardMode,std::pair<BoardMode_const,QRadioButton>,std::_Select1st<std::pair<BoardMode_const,QRadioButton>>,std::less<BoardMode>,std::allocator<std::pair<BoardMode_const,QRadioButton>>>
  ::_M_emplace_unique<BoardMode,char_const(&)[8]>
            ((_Rb_tree<BoardMode,std::pair<BoardMode_const,QRadioButton>,std::_Select1st<std::pair<BoardMode_const,QRadioButton>>,std::less<BoardMode>,std::allocator<std::pair<BoardMode_const,QRadioButton>>>
              *)this_00,(BoardMode *)&local_e0,(char (*) [8])0x11647d);
  local_e0.d._0_4_ = 0;
  pmVar6 = std::
           map<BoardMode,_QRadioButton,_std::less<BoardMode>,_std::allocator<std::pair<const_BoardMode,_QRadioButton>_>_>
           ::operator[](this_00,(key_type *)&local_e0);
  QAbstractButton::setChecked(SUB81(pmVar6,0));
  pQVar3 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar3);
  for (p_Var4 = (pPVar1->radioModeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(pPVar1->radioModeMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    QBoxLayout::addSpacing((int)pQVar3);
    QBoxLayout::addWidget(pQVar3,&p_Var4[1]._M_parent,0,0);
    QString::QString((QString *)&local_e0,"margin-left: 5px");
    QWidget::setStyleSheet((QString *)&p_Var4[1]._M_parent);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  }
  QBoxLayout::addSpacing((int)pQVar3);
  pQVar5 = (QGroupBox *)operator_new(0x28);
  QString::QString((QString *)&local_e0,"Kind of Board");
  QGroupBox::QGroupBox(pQVar5,(QString *)&local_e0,(QWidget *)local_c8);
  __x = local_b8;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  QWidget::setLayout((QLayout *)pQVar5);
  this_01 = (QPushButton *)operator_new(0x28);
  QString::QString((QString *)&local_e0,"Generate Board");
  QPushButton::QPushButton(this_01,(QString *)&local_e0,(QWidget *)local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  QString::QString((QString *)&local_e0,"height:20px");
  QWidget::setStyleSheet((QString *)this_01);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  std::function<void_()>::function(&local_50,__x);
  QObject::connect<void(QAbstractButton::*)(bool),std::function<void()>>
            (local_98,(offset_in_QAbstractButton_to_subr)this_01,
             (function<void_()> *)QAbstractButton::clicked);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  this_02 = (QPushButton *)operator_new(0x28);
  QString::QString((QString *)&local_e0,"Solve Board");
  QPushButton::QPushButton(this_02,(QString *)&local_e0,(QWidget *)local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  QString::QString((QString *)&local_e0,"height:20px");
  QWidget::setStyleSheet((QString *)this_02);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  std::function<void_()>::function(&local_70,__x + 1);
  QObject::connect<void(QAbstractButton::*)(bool),std::function<void()>>
            (local_a0,(offset_in_QAbstractButton_to_subr)this_02,
             (function<void_()> *)QAbstractButton::clicked);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  this_03 = (QPushButton *)operator_new(0x28);
  QString::QString((QString *)&local_e0,"Undo Move");
  QPushButton::QPushButton(this_03,(QString *)&local_e0,(QWidget *)local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  QString::QString((QString *)&local_e0,"height:20px");
  QWidget::setStyleSheet((QString *)this_03);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  std::function<void_()>::function(&local_90,__x + 2);
  QObject::connect<void(QAbstractButton::*)(bool),std::function<void()>>
            (local_a8,(offset_in_QAbstractButton_to_subr)this_03,
             (function<void_()> *)QAbstractButton::clicked);
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  std::_Function_base::~_Function_base(&local_90.super__Function_base);
  pQVar3 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar3);
  iVar7 = (int)pQVar3;
  QLayout::setContentsMargins(iVar7,0x1e,0,0x14);
  QBoxLayout::addWidget(pQVar3,this_01,0,0);
  QBoxLayout::addSpacing(iVar7);
  QBoxLayout::addWidget(pQVar3,this_02,0,0);
  QBoxLayout::addSpacing(iVar7);
  QBoxLayout::addWidget(pQVar3,this_03,0,0);
  QBoxLayout::addSpacing(iVar7);
  QBoxLayout::addWidget(pQVar3,local_c0,0,0);
  QBoxLayout::addStretch(iVar7);
  QBoxLayout::addWidget(pQVar3,pQVar5,0,0);
  QBoxLayout::addStretch(iVar7);
  return pQVar3;
}

Assistant:

QVBoxLayout* Panel::createLayout( std::array<std::function<void()>, 3>& panelSlots, QMainWindow* mainWindow )
{
    radioSizeMap.emplace( BoardSize::FOUR, "4" );
    radioSizeMap.emplace( BoardSize::FIVE, "5" );
    radioSizeMap.emplace( BoardSize::SIX, "6" );
    radioSizeMap.emplace( BoardSize::SEVEN, "7" );
    radioSizeMap[BoardSize::FOUR].setChecked( true );

    QVBoxLayout* radioSizeLayout = new QVBoxLayout();
    for( auto& radio : radioSizeMap | std::views::values )
    {
        radioSizeLayout->addSpacing( 10 );
        radioSizeLayout->addWidget( &radio );
        radio.setStyleSheet( STYLE_MARGIN_LEFT );
    }
    radioSizeLayout->addSpacing( 30 );

    QGroupBox* radioSizeBox = new QGroupBox( "Dimension of Board", mainWindow );
    radioSizeBox->setLayout( radioSizeLayout );

    radioModeMap.emplace( BoardMode::NUMERIC, "Numeric" );
    radioModeMap.emplace( BoardMode::GRAPHIC, "Graphic" );
    radioModeMap[BoardMode::NUMERIC].setChecked( true );

    QVBoxLayout* radioModeLayout = new QVBoxLayout();
    for( auto& radio : radioModeMap | std::views::values )
    {
        radioModeLayout->addSpacing( 10 );
        radioModeLayout->addWidget( &radio );
        radio.setStyleSheet( STYLE_MARGIN_LEFT );
    }
    radioModeLayout->addSpacing( 30 );

    QGroupBox* radioModeBox = new QGroupBox( "Kind of Board", mainWindow );
    radioModeBox->setLayout( radioModeLayout );

    QPushButton* pushRandom = new QPushButton( "Generate Board", mainWindow );
    pushRandom->setStyleSheet( STYLE_HEIGHT );
    QObject::connect( pushRandom, &QPushButton::clicked, panelSlots[0] );

    QPushButton* pushSolve = new QPushButton( "Solve Board", mainWindow );
    pushSolve->setStyleSheet( STYLE_HEIGHT );
    QObject::connect( pushSolve, &QPushButton::clicked, panelSlots[1] );

    QPushButton* pushUndo = new QPushButton( "Undo Move", mainWindow );
    pushUndo->setStyleSheet( STYLE_HEIGHT );
    QObject::connect( pushUndo, &QPushButton::clicked, panelSlots[2] );

    QVBoxLayout* panelLayout = new QVBoxLayout();
    panelLayout->setContentsMargins( 30, 0, 20, 0 );
    panelLayout->addWidget( pushRandom );
    panelLayout->addSpacing( 15 );
    panelLayout->addWidget( pushSolve );
    panelLayout->addSpacing( 15 );
    panelLayout->addWidget( pushUndo );
    panelLayout->addSpacing( 30 );
    panelLayout->addWidget( radioSizeBox );
    panelLayout->addStretch();
    panelLayout->addWidget( radioModeBox );
    panelLayout->addStretch();
    return panelLayout;
}